

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

void __thiscall
despot::MemoryPool<despot::RockSampleState>::Free
          (MemoryPool<despot::RockSampleState> *this,RockSampleState *obj)

{
  RockSampleState *obj_local;
  
  obj_local = obj;
  if (obj->field_0x8 != '\0') {
    obj->field_0x8 = 0;
    std::vector<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>::push_back
              (&this->freelist_,&obj_local);
    this->num_allocated_ = this->num_allocated_ + -1;
    return;
  }
  __assert_fail("obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x3b,
                "void despot::MemoryPool<despot::RockSampleState>::Free(T *) [T = despot::RockSampleState]"
               );
}

Assistant:

void Free(T* obj) {
		assert(obj->IsAllocated());
		obj->ClearAllocated();
		freelist_.push_back(obj);
		num_allocated_--;
	}